

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearlyTransformedCosines.cpp
# Opt level: O0

void __thiscall
arealights::LinearlyTransformedCosines::loadLookupTextures(LinearlyTransformedCosines *this)

{
  uint uVar1;
  uint uVar2;
  PFNGLTEXIMAGE2DPROC p_Var3;
  bool bVar4;
  string *this_00;
  pointer paVar5;
  float *pfVar6;
  Writer *pWVar7;
  unique_ptr<fw::Texture,_std::default_delete<fw::Texture>_> local_150;
  unique_ptr<fw::Texture,_std::default_delete<fw::Texture>_> local_148;
  Writer local_140;
  Writer local_d0;
  GLenum local_5c;
  GLuint local_58;
  GLenum err;
  uint ltcMatB;
  uint ltcMatA;
  allocator<char> local_39;
  string local_38;
  unique_ptr<arealights::alf_file,_std::default_delete<arealights::alf_file>_> local_18;
  unique_ptr<arealights::alf_file,_std::default_delete<arealights::alf_file>_> lookup_alf;
  LinearlyTransformedCosines *this_local;
  
  lookup_alf._M_t.
  super___uniq_ptr_impl<arealights::alf_file,_std::default_delete<arealights::alf_file>_>._M_t.
  super__Tuple_impl<0UL,_arealights::alf_file_*,_std::default_delete<arealights::alf_file>_>.
  super__Head_base<0UL,_arealights::alf_file_*,_false>._M_head_impl =
       (__uniq_ptr_data<arealights::alf_file,_std::default_delete<arealights::alf_file>,_true,_true>
       )(__uniq_ptr_data<arealights::alf_file,_std::default_delete<arealights::alf_file>,_true,_true>
         )this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"../assets/lookups/result_64x64.ltc",&local_39);
  read_alf_file((arealights *)&local_18,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  bVar4 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18);
  if (!bVar4) {
    ltcMatB._2_1_ = 1;
    this_00 = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,"Cannot load LTC lookup tables.",(allocator<char> *)((long)&ltcMatB + 3));
    ltcMatB._2_1_ = 0;
    __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  (*glad_glGenTextures)(1,&err);
  (*glad_glGenTextures)(1,&local_58);
  (*glad_glActiveTexture)(0x84c0);
  (*glad_glBindTexture)(0xde1,err);
  (*glad_glTexParameteri)(0xde1,0x2801,0x2600);
  (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
  (*glad_glTexParameteri)(0xde1,0x2802,0x812f);
  (*glad_glTexParameteri)(0xde1,0x2803,0x812f);
  p_Var3 = glad_glTexImage2D;
  paVar5 = std::unique_ptr<arealights::alf_file,_std::default_delete<arealights::alf_file>_>::
           operator->(&local_18);
  uVar1 = (paVar5->header).num_samples_roughness;
  paVar5 = std::unique_ptr<arealights::alf_file,_std::default_delete<arealights::alf_file>_>::
           operator->(&local_18);
  uVar2 = (paVar5->header).num_samples_angle;
  paVar5 = std::unique_ptr<arealights::alf_file,_std::default_delete<arealights::alf_file>_>::
           operator->(&local_18);
  pfVar6 = std::vector<float,_std::allocator<float>_>::data(&paVar5->texture_slot1);
  (*p_Var3)(0xde1,0,0x8814,uVar1,uVar2,0,0x1908,0x1406,pfVar6);
  while( true ) {
    local_5c = (*glad_glGetError)();
    if (local_5c == 0) break;
    el::base::Writer::Writer
              (&local_d0,Error,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/LinearlyTransformedCosines.cpp"
               ,0x91,"void arealights::LinearlyTransformedCosines::loadLookupTextures()",NormalLog,0
              );
    pWVar7 = el::base::Writer::construct(&local_d0,1,"framework");
    el::base::Writer::operator<<(pWVar7,&local_5c);
    el::base::Writer::~Writer(&local_d0);
  }
  (*glad_glBindTexture)(0xde1,local_58);
  (*glad_glTexParameteri)(0xde1,0x2801,0x2600);
  (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
  (*glad_glTexParameteri)(0xde1,0x2802,0x812f);
  (*glad_glTexParameteri)(0xde1,0x2803,0x812f);
  p_Var3 = glad_glTexImage2D;
  paVar5 = std::unique_ptr<arealights::alf_file,_std::default_delete<arealights::alf_file>_>::
           operator->(&local_18);
  uVar1 = (paVar5->header).num_samples_roughness;
  paVar5 = std::unique_ptr<arealights::alf_file,_std::default_delete<arealights::alf_file>_>::
           operator->(&local_18);
  uVar2 = (paVar5->header).num_samples_angle;
  paVar5 = std::unique_ptr<arealights::alf_file,_std::default_delete<arealights::alf_file>_>::
           operator->(&local_18);
  pfVar6 = std::vector<float,_std::allocator<float>_>::data(&paVar5->texture_slot2);
  (*p_Var3)(0xde1,0,0x8815,uVar1,uVar2,0,0x1907,0x1406,pfVar6);
  while( true ) {
    local_5c = (*glad_glGetError)();
    if (local_5c == 0) break;
    el::base::Writer::Writer
              (&local_140,Error,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/LinearlyTransformedCosines.cpp"
               ,0xa0,"void arealights::LinearlyTransformedCosines::loadLookupTextures()",NormalLog,0
              );
    pWVar7 = el::base::Writer::construct(&local_140,1,"framework");
    el::base::Writer::operator<<(pWVar7,&local_5c);
    el::base::Writer::~Writer(&local_140);
  }
  (*glad_glBindTexture)(0xde1,0);
  std::make_unique<fw::Texture,unsigned_int&>((uint *)&local_148);
  std::unique_ptr<fw::Texture,_std::default_delete<fw::Texture>_>::operator=
            (&this->_ltcLookupMatA,&local_148);
  std::unique_ptr<fw::Texture,_std::default_delete<fw::Texture>_>::~unique_ptr(&local_148);
  std::make_unique<fw::Texture,unsigned_int&>((uint *)&local_150);
  std::unique_ptr<fw::Texture,_std::default_delete<fw::Texture>_>::operator=
            (&this->_ltcLookupMatB,&local_150);
  std::unique_ptr<fw::Texture,_std::default_delete<fw::Texture>_>::~unique_ptr(&local_150);
  std::unique_ptr<arealights::alf_file,_std::default_delete<arealights::alf_file>_>::~unique_ptr
            (&local_18);
  return;
}

Assistant:

void LinearlyTransformedCosines::loadLookupTextures()
{
    auto lookup_alf = read_alf_file("../assets/lookups/result_64x64.ltc");

    if (!lookup_alf) {
        throw std::string("Cannot load LTC lookup tables.");
    }

    unsigned int ltcMatA, ltcMatB;
    glGenTextures(1, &ltcMatA);
    glGenTextures(1, &ltcMatB);

    glActiveTexture(GL_TEXTURE0);

    glBindTexture(GL_TEXTURE_2D, ltcMatA);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F,
        lookup_alf->header.num_samples_roughness, lookup_alf->header.num_samples_angle,
        0, GL_RGBA, GL_FLOAT, lookup_alf->texture_slot1.data());

    GLenum err;
    while((err = glGetError()) != GL_NO_ERROR)
    {
        LOG(ERROR) << err;
    }

    glBindTexture(GL_TEXTURE_2D, ltcMatB);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB32F,
        lookup_alf->header.num_samples_roughness, lookup_alf->header.num_samples_angle,
        0, GL_RGB, GL_FLOAT, lookup_alf->texture_slot2.data());

    while((err = glGetError()) != GL_NO_ERROR)
    {
        LOG(ERROR) << err;
    }

    glBindTexture(GL_TEXTURE_2D, 0);

    _ltcLookupMatA = std::make_unique<fw::Texture>(ltcMatA);
    _ltcLookupMatB = std::make_unique<fw::Texture>(ltcMatB);
}